

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.h
# Opt level: O0

void __thiscall
cmSetSourceFilesPropertiesCommand::~cmSetSourceFilesPropertiesCommand
          (cmSetSourceFilesPropertiesCommand *this)

{
  cmSetSourceFilesPropertiesCommand *this_local;
  
  ~cmSetSourceFilesPropertiesCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmSetSourceFilesPropertiesCommand; }